

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadMESH(B3DImporter *this)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  undefined1 local_38 [8];
  string t;
  int v0;
  B3DImporter *this_local;
  
  ReadInt(this);
  sVar3 = std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::
          size(&this->_vertices);
  t.field_2._12_4_ = (undefined4)sVar3;
  while (uVar2 = ChunkSize(this), uVar2 != 0) {
    ReadChunk_abi_cxx11_((string *)local_38,this);
    bVar1 = std::operator==((string *)local_38,"VRTS");
    if (bVar1) {
      ReadVRTS(this);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"TRIS");
      if (bVar1) {
        ReadTRIS(this,t.field_2._12_4_);
      }
    }
    ExitChunk(this);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void B3DImporter::ReadMESH(){
    /*int matid=*/ReadInt();

    int v0= static_cast<int>(_vertices.size());

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="VRTS" ){
            ReadVRTS();
        }else if( t=="TRIS" ){
            ReadTRIS( v0 );
        }
        ExitChunk();
    }
}